

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
::fast_copy_elements_from
          (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
           *this,table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                 *x)

{
  value_type_pointer __dest;
  value_type_pointer __src;
  size_t sVar1;
  
  __dest = (this->arrays).elements_;
  if ((__dest != (value_type_pointer)0x0) &&
     (__src = (x->arrays).elements_, __src != (value_type_pointer)0x0)) {
    memcpy(__dest,__src,(x->arrays).groups_size_mask * 0x168 + 0x150);
    memcpy((this->arrays).groups_,(x->arrays).groups_,(this->arrays).groups_size_mask * 0x10 + 0x10)
    ;
    sVar1 = (x->size_ctrl).size;
    (this->size_ctrl).ml = (x->size_ctrl).ml;
    (this->size_ctrl).size = sVar1;
  }
  return;
}

Assistant:

void fast_copy_elements_from(const table_core& x) {
        if (arrays.elements() && x.arrays.elements()) {
            copy_elements_array_from(x);
            copy_groups_array_from(x);
            size_ctrl.ml = std::size_t(x.size_ctrl.ml);
            size_ctrl.size = std::size_t(x.size_ctrl.size);
        }
    }